

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.hpp
# Opt level: O2

void __thiscall cinatra::cookie::cookie(cookie *this)

{
  allocator<char> local_36;
  allocator<char> local_35;
  allocator<char> local_34;
  allocator<char> local_33;
  allocator<char> local_32;
  allocator<char> local_31;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)this,"",&local_31);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->value_,"",&local_32);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->comment_,"",&local_33);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->domain_,"",&local_34);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->priority_,"",&local_35);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->path_,"",&local_36);
  this->max_age_ = -1;
  this->version_ = 0;
  this->secure_ = false;
  this->http_only_ = false;
  return;
}

Assistant:

cookie() = default;